

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O1

void __thiscall SimpleLoggerMgr::SimpleLoggerMgr(SimpleLoggerMgr *this)

{
  int iVar1;
  char *pcVar2;
  __sighandler_t p_Var3;
  string env_segv_str;
  thread local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  condition_variable *local_60;
  condition_variable *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  *(undefined8 *)((long)&(this->loggersLock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->loggersLock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->loggersLock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->loggersLock).super___mutex_base._M_mutex + 8) = 0;
  (this->loggersLock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->loggers)._M_h._M_buckets = &(this->loggers)._M_h._M_single_bucket;
  (this->loggers)._M_h._M_bucket_count = 1;
  (this->loggers)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->loggers)._M_h._M_element_count = 0;
  (this->loggers)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->loggers)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->loggers)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->activeThreadsLock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->activeThreadsLock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->activeThreadsLock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->activeThreadsLock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->activeThreadsLock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->activeThreads)._M_h._M_buckets = &(this->activeThreads)._M_h._M_single_bucket;
  (this->activeThreads)._M_h._M_bucket_count = 1;
  (this->activeThreads)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->activeThreads)._M_h._M_element_count = 0;
  (this->activeThreads)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->activeThreads)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->activeThreads)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->tFlush)._M_id._M_thread = 0;
  (this->tCompress)._M_id._M_thread = 0;
  (this->pendingCompElems).
  super__List_base<SimpleLoggerMgr::CompElem_*,_std::allocator<SimpleLoggerMgr::CompElem_*>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->pendingCompElems;
  (this->pendingCompElems).
  super__List_base<SimpleLoggerMgr::CompElem_*,_std::allocator<SimpleLoggerMgr::CompElem_*>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->pendingCompElems;
  local_58 = &this->cvFlusher;
  (this->pendingCompElemsLock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->pendingCompElemsLock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->pendingCompElemsLock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->pendingCompElemsLock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->pendingCompElems).
  super__List_base<SimpleLoggerMgr::CompElem_*,_std::allocator<SimpleLoggerMgr::CompElem_*>_>.
  _M_impl._M_node._M_size = 0;
  (this->pendingCompElemsLock).super___mutex_base._M_mutex.__align = 0;
  std::condition_variable::condition_variable(local_58);
  (this->cvFlusherLock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->cvFlusherLock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->cvFlusherLock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->cvFlusherLock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->cvFlusherLock).super___mutex_base._M_mutex + 8) = 0;
  local_60 = &this->cvCompressor;
  std::condition_variable::condition_variable(local_60);
  local_68 = &(this->globalCriticalInfo).field_2;
  *(undefined8 *)
   ((long)&(this->cvCompressorLock).super___mutex_base._M_mutex.__data.__list.__prev + 1) = 0;
  *(undefined8 *)
   ((long)&(this->cvCompressorLock).super___mutex_base._M_mutex.__data.__list.__next + 1) = 0;
  *(undefined8 *)((long)&(this->cvCompressorLock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->cvCompressorLock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->cvCompressorLock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->cvCompressorLock).super___mutex_base._M_mutex + 8) = 0;
  this->oldSigSegvHandler = (_func_void_int *)0x0;
  this->oldSigAbortHandler = (_func_void_int *)0x0;
  (this->globalCriticalInfo)._M_dataplus._M_p = (pointer)local_68;
  (this->globalCriticalInfo)._M_string_length = 0;
  (this->globalCriticalInfo).field_2._M_local_buf[0] = '\0';
  this->stackTraceBuffer = (char *)0x0;
  (this->crashOriginThread).super___atomic_base<unsigned_long>._M_i = 0;
  (this->crashDumpPath)._M_dataplus._M_p = (pointer)&(this->crashDumpPath).field_2;
  (this->crashDumpPath)._M_string_length = 0;
  (this->crashDumpPath).field_2._M_local_buf[0] = '\0';
  std::ofstream::ofstream(&this->crashDumpFile);
  this->crashDumpOriginOnly = true;
  this->exitOnCrash = false;
  (this->abortTimer).super___atomic_base<unsigned_long>._M_i = 0;
  (this->crashDumpThreadStacks).
  super__Vector_base<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->crashDumpThreadStacks).
  super__Vector_base<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->crashDumpThreadStacks).
  super__Vector_base<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = 0;
  local_40[0] = 0;
  local_50 = local_40;
  pcVar2 = getenv("SIMPLELOGGER_HANDLE_SEGV");
  if (pcVar2 != (char *)0x0) {
    strlen(pcVar2);
    std::__cxx11::string::_M_replace((ulong)&local_50,0,(char *)0x0,(ulong)pcVar2);
  }
  iVar1 = std::__cxx11::string::compare((char *)&local_50);
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)&local_50);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)&local_50);
        if (iVar1 != 0) {
          p_Var3 = signal(0xb,handleSegFault);
          this->oldSigSegvHandler = (_func_void_int *)p_Var3;
          p_Var3 = signal(6,handleSegAbort);
          this->oldSigAbortHandler = (_func_void_int *)p_Var3;
        }
      }
    }
  }
  pcVar2 = (char *)malloc(0x10000);
  this->stackTraceBuffer = pcVar2;
  std::thread::thread<void(&)(),,void>(&local_70,flushWorker);
  if ((this->tFlush)._M_id._M_thread == 0) {
    (this->tFlush)._M_id._M_thread = (native_handle_type)local_70._M_id._M_thread;
    std::thread::thread<void(&)(),,void>(&local_70,compressWorker);
    if ((this->tCompress)._M_id._M_thread == 0) {
      (this->tCompress)._M_id._M_thread = (native_handle_type)local_70._M_id._M_thread;
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      return;
    }
  }
  std::terminate();
}

Assistant:

SimpleLoggerMgr::SimpleLoggerMgr()
    : termination(false)
    , oldSigSegvHandler(nullptr)
    , oldSigAbortHandler(nullptr)
    , stackTraceBuffer(nullptr)
    , crashOriginThread(0)
    , crashDumpOriginOnly(true)
    , exitOnCrash(false)
    , abortTimer(0)
{
#if defined(__linux__) || defined(__APPLE__)
    std::string env_segv_str;
    const char* env_segv = std::getenv("SIMPLELOGGER_HANDLE_SEGV");
    if (env_segv) env_segv_str = env_segv;

    if ( env_segv_str == "OFF" ||
         env_segv_str == "off" ||
         env_segv_str == "FALSE" ||
         env_segv_str == "false" ) {
        // Manually turned off by user, via env var.
    } else {
        oldSigSegvHandler = signal(SIGSEGV, SimpleLoggerMgr::handleSegFault);
        oldSigAbortHandler = signal(SIGABRT, SimpleLoggerMgr::handleSegAbort);
    }
    stackTraceBuffer = (char*)malloc(stackTraceBufferSize);

#endif
    tFlush = std::thread(SimpleLoggerMgr::flushWorker);
    tCompress = std::thread(SimpleLoggerMgr::compressWorker);
}